

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_grzip.c
# Opt level: O3

int grzip_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  long in_RAX;
  long *plVar2;
  ssize_t avail;
  long local_8;
  
  local_8 = in_RAX;
  plVar2 = (long *)__archive_read_filter_ahead(filter,0xc,&local_8);
  iVar1 = 0;
  if (((plVar2 != (long *)0x0) && (iVar1 = 0, local_8 != 0)) &&
     (iVar1 = 0x60, (int)plVar2[1] != 0x293a0402 || *plVar2 != 0x494970695a5247)) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
grzip_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail;

	(void)self; /* UNUSED */

	p = __archive_read_filter_ahead(filter, sizeof(grzip_magic), &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, grzip_magic, sizeof(grzip_magic)))
		return (0);

	return (sizeof(grzip_magic) * 8);
}